

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall
wasm::PrintExpressionContents::visitRefI31(PrintExpressionContents *this,RefI31 *curr)

{
  ostream *stream;
  Shareability SVar1;
  uintptr_t in_RAX;
  size_t sVar2;
  char *__s;
  HeapType local_28;
  
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)59>).super_Expression.type.id == 1) {
    __s = "ref.i31";
    local_28.id = in_RAX;
  }
  else {
    local_28 = wasm::Type::getHeapType
                         (&(curr->super_SpecificExpression<(wasm::Expression::Id)59>).
                           super_Expression.type);
    SVar1 = HeapType::getShared(&local_28);
    __s = "ref.i31";
    if (SVar1 == Shared) {
      __s = "ref.i31_shared";
    }
  }
  stream = this->o;
  sVar2 = strlen(__s);
  Colors::outputColorCode(stream,"\x1b[35m");
  Colors::outputColorCode(stream,"\x1b[1m");
  std::__ostream_insert<char,std::char_traits<char>>(stream,__s,sVar2);
  Colors::outputColorCode(stream,"\x1b[0m");
  return;
}

Assistant:

void visitRefI31(RefI31* curr) {
    bool shared =
      curr->type != Type::unreachable && curr->type.getHeapType().isShared();
    printMedium(o, shared ? "ref.i31_shared" : "ref.i31");
  }